

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void CopyTileWithColorTransform
               (int xsize,int ysize,int tile_x,int tile_y,int max_tile_size,
               VP8LMultipliers color_transform,uint32_t *argb)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  undefined4 in_R9D;
  int yscan;
  int xscan;
  int local_20;
  VP8LMultipliers local_3;
  
  local_3._0_2_ = SUB42(in_R9D,0);
  local_3.red_to_blue_ = (uint8_t)((uint)in_R9D >> 0x10);
  iVar1 = GetMin(in_R8D,in_EDI - in_EDX);
  local_20 = GetMin(in_R8D,in_ESI - in_ECX);
  _yscan = (uint32_t *)((long)_yscan + (long)(in_ECX * in_EDI + in_EDX) * 4);
  while( true ) {
    if (local_20 < 1) break;
    (*VP8LTransformColor)(&local_3,_yscan,iVar1);
    _yscan = _yscan + in_EDI;
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

static void CopyTileWithColorTransform(int xsize, int ysize,
                                       int tile_x, int tile_y,
                                       int max_tile_size,
                                       VP8LMultipliers color_transform,
                                       uint32_t* argb) {
  const int xscan = GetMin(max_tile_size, xsize - tile_x);
  int yscan = GetMin(max_tile_size, ysize - tile_y);
  argb += tile_y * xsize + tile_x;
  while (yscan-- > 0) {
    VP8LTransformColor(&color_transform, argb, xscan);
    argb += xsize;
  }
}